

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

int search::negamax(int alpha,int beta,int depth,Board *pos,SearchInfo *info,PVTable *pvtable)

{
  long lVar1;
  pointer pMVar2;
  pointer pMVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  Move MVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Move bestMove;
  vector<board::Move,_std::allocator<board::Move>_> moves;
  Move move;
  int local_b8;
  Move local_a0;
  int local_94;
  int local_90;
  int local_8c;
  vector<board::Move,_std::allocator<board::Move>_> local_88;
  MoveList local_70;
  int (*local_58) [120];
  Move local_50;
  Move local_48;
  Move local_40;
  Move local_38;
  
  uVar10 = info->nodes;
  if ((uVar10 & 0x7ff) == 0) {
    checkup(info);
    uVar10 = info->nodes;
  }
  info->nodes = uVar10 + 1;
  bVar4 = isRepetition(pos);
  if ((99 < pos->fiftyMove || bVar4) && (0 < pos->ply)) {
    return 0;
  }
  piVar8 = &pos->side;
  if (pos->side == 0) {
    piVar8 = pos->board + 0x3c;
  }
  bVar4 = board::Board::sqAttacked(pos,(*(int (*) [10])(piVar8 + 0x86))[0],pos->side ^ 1);
  iVar11 = (uint)bVar4 + depth;
  if (iVar11 == 0) {
    iVar6 = board::evaluate::score(pos);
    if (alpha < iVar6) {
      alpha = iVar6;
    }
    if (beta <= iVar6) {
      return beta;
    }
  }
  movegen::generateAll(&local_70,pos,iVar11 == 0);
  std::vector<board::Move,_std::allocator<board::Move>_>::vector(&local_88,&local_70.moves);
  if ((Move)local_70.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
            super__Vector_impl_data._M_start != (Move)0x0) {
    operator_delete(local_70.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.moves.
                          super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.moves.
                          super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  MVar9 = PVTable::getMove(pvtable,pos);
  pMVar3 = local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar2 = local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = alpha;
  if ((MVar9.value == 0) ||
     (local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_a0.value = 0;
    local_a0.score = 0;
    if ((long)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      local_70.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_38 = (Move)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<board::Move*,std::vector<board::Move,std::allocator<board::Move>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (&local_70,&local_38,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      local_40 = (Move)pMVar3;
      local_48 = (Move)pMVar2;
      std::
      __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<board::Move*,std::vector<board::Move,std::allocator<board::Move>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      local_50 = (Move)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
      if (local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_8c = -beta;
        local_90 = iVar11 + -1;
        iVar12 = 0;
        if (iVar11 < 1) {
          local_90 = 0;
        }
        local_58 = pos->searchHistory;
        MVar9 = (Move)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl
                      .super__Vector_impl_data._M_start;
        local_94 = beta;
        do {
          local_70.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)MVar9;
          bVar5 = board::makemove::move((Move *)&local_70,pos);
          if (bVar5) {
            iVar7 = negamax(local_8c,-iVar6,local_90,pos,info,pvtable);
            board::makemove::undo(pos);
            if (info->stopped != false) {
              local_b8 = 0;
              goto LAB_0013372d;
            }
            iVar12 = iVar12 + 1;
            iVar13 = -iVar7;
            if (SBORROW4(iVar6,iVar13) != iVar6 + iVar7 < 0) {
              if (local_94 <= iVar13) {
                local_b8 = local_94;
                if ((0 < iVar11) &&
                   (((ulong)local_70.moves.
                            super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                            super__Vector_impl_data._M_start & 0x7c000) == 0)) {
                  pos->searchKillers[1][pos->ply] = pos->searchKillers[0][pos->ply];
                  pos->searchKillers[0][pos->ply] =
                       (uint)local_70.moves.
                             super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                             super__Vector_impl_data._M_start;
                }
                goto LAB_0013372d;
              }
              local_a0 = (Move)local_70.moves.
                               super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl
                               .super__Vector_impl_data._M_start;
              iVar6 = iVar13;
              if (((ulong)local_70.moves.
                          super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                          super__Vector_impl_data._M_start & 0x7c000) == 0 && 0 < iVar11) {
                piVar8 = (int *)((long)local_58[pos->board
                                                [(uint)local_70.moves.
                                                                                                              
                                                  super__Vector_base<board::Move,_std::allocator<board::Move>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 0x7f]]
                                + (ulong)((uint)((ulong)local_70.moves.
                                                                                                                
                                                  super__Vector_base<board::Move,_std::allocator<board::Move>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5) &
                                         0x1fc));
                *piVar8 = *piVar8 + iVar11;
              }
            }
          }
          MVar9 = (Move)((long)MVar9 + 8);
        } while (MVar9 != local_50);
        bVar5 = iVar12 == 0;
        goto LAB_001336d7;
      }
    }
  }
  else {
    local_a0.value = 0;
    local_a0.score = 0;
  }
  bVar5 = true;
LAB_001336d7:
  if ((bool)(0 < iVar11 & bVar5)) {
    local_b8 = 0;
    if (bVar4) {
      local_b8 = pos->ply + -0x7ffffffe;
    }
  }
  else {
    local_b8 = alpha;
    if (iVar6 != alpha) {
      PVTable::addMove(pvtable,pos,&local_a0);
      local_b8 = iVar6;
    }
  }
LAB_0013372d:
  if ((Move)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
            super__Vector_impl_data._M_start != (Move)0x0) {
    operator_delete(local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_b8;
}

Assistant:

int search::negamax(int alpha, int beta, int depth, board::Board& pos, SearchInfo& info, PVTable& pvtable)
{
    if ((info.getNodes() & 2047) == 0) {
        checkup(info);
    }
    info.incrementNodes();
    if ((isRepetition(pos) || pos.getFiftyMove() >= 100) && pos.getPly() > 0) {
        return 0;
    }
    bool inCheck =
        pos.sqAttacked(pos.getPieceList(pos.getSide() == board::WHITE ? board::WK : board::BK)[0], pos.getSide() ^ 1);
    if (inCheck) {
        depth++;
    }
    if (depth == 0) {
        int score = board::evaluate::score(pos);
        if (score >= beta) {
            return beta;
        }
        if (score > alpha) {
            alpha = score;
        }
    }
    std::vector<board::Move> moves = movegen::generateAll(pos, depth == 0).getMoves();
    board::Move pvMove = pvtable.getMove(pos);
    if (pvMove.getValue() != 0) {
        for (board::Move move : moves) {
            if (pvMove.getValue() == move.getValue()) {
                move.addScore(2000000);
                break;
            }
        }
    }
    board::Move bestMove;
    int legal = 0;
    int oldAlpha = alpha;
    int score = NEG_INFINITY;
    std::sort(moves.rbegin(), moves.rend());
    for (board::Move move : moves) {
        if (!board::makemove::move(move, pos)) {
            continue;
        }
        legal++;
        score = -negamax(-beta, -alpha, depth > 0 ? depth - 1 : 0, pos, info, pvtable);
        board::makemove::undo(pos);
        if (info.getStopped()) {
            return 0;
        }
        if (score > alpha) {
            if (score >= beta) {
                if (depth > 0) {
                    if (!(move.getValue() & board::Move::MFLAGCAP)) {
                        pos.addSearchKiller(move.getValue());
                    }
                }
                return beta;
            }
            alpha = score;
            bestMove = move;
            if (depth > 0) {
                if (!(move.getValue() & board::Move::MFLAGCAP)) {
                    pos.incrementSearchHistory(board::Move::TOSQ(move.getValue()), board::Move::FROMSQ(move.getValue()),
                                               depth);
                }
            }
        }
    }
    if (depth > 0 && legal == 0) {
        if (inCheck) {
            return -POS_INFINITY + pos.getPly();
        }
        return 0;
    }
    if (alpha != oldAlpha) {
        pvtable.addMove(pos, bestMove);
    }
    return alpha;
}